

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O1

seconds __thiscall absl::lts_20250127::ToChronoSeconds(lts_20250127 *this,Duration d)

{
  seconds sVar1;
  
  if (d.rep_hi_.lo_ != 0xffffffff) {
    return (seconds)((ulong)(d.rep_hi_.lo_ - 1 < 0xfffffffe && (long)this < 0) + (long)this);
  }
  sVar1.__r = -0x8000000000000000;
  if (-1 < (long)this) {
    sVar1.__r = 0x7fffffffffffffff;
  }
  return (seconds)sVar1.__r;
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}